

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

int dec_dt_allow(int cu_w,int cu_h,int pred_mode,int max_size)

{
  bool local_2a;
  bool local_29;
  int vert_allow;
  int hori_allow;
  int min_size;
  int max_size_local;
  int pred_mode_local;
  int cu_h_local;
  int cu_w_local;
  
  if ((max_size < cu_w) || (max_size < cu_h)) {
    cu_h_local = 0;
  }
  else {
    local_29 = 0xf < cu_h && cu_w < cu_h * 4;
    local_2a = 0xf < cu_w && cu_h < cu_w * 4;
    cu_h_local = (uint)local_29 + (uint)local_2a * 2;
  }
  return cu_h_local;
}

Assistant:

int dec_dt_allow(int cu_w, int cu_h, int pred_mode, int max_size)
{
    if (cu_w <= max_size && cu_h <= max_size) {
        const int min_size = 16;
        int hori_allow = cu_h >= min_size && cu_w < (cu_h << 2);
        int vert_allow = cu_w >= min_size && cu_h < (cu_w << 2);
        return hori_allow + (vert_allow << 1);
    } else {
        return 0;
    }
}